

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

int __thiscall Map::GenerateItemID(Map *this)

{
  _List_node_base *p_Var1;
  short *psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *plVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  _List_node_base *p_Var7;
  bool bVar8;
  
  plVar3 = &this->items;
  p_Var7 = (_List_node_base *)plVar3;
  iVar5 = 1;
LAB_001714d8:
  do {
    p_Var1 = (((_List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *
               )&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var1 != (_List_node_base *)plVar3) {
      psVar2 = (short *)p_Var1[1]._M_next;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1[1]._M_prev;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      iVar6 = (int)*psVar2;
      iVar4 = iVar6 + 1;
      if (iVar5 != iVar6) {
        iVar4 = iVar5;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      bVar8 = iVar5 != iVar6;
      p_Var7 = p_Var1;
      iVar5 = iVar4;
      if (bVar8) goto LAB_001714d8;
    }
    p_Var7 = (_List_node_base *)plVar3;
    if (p_Var1 == (_List_node_base *)plVar3) {
      return iVar5;
    }
  } while( true );
}

Assistant:

int Map::GenerateItemID() const
{
	int lowest_free_id = 1;
	restart_loop:
	UTIL_FOREACH(this->items, item)
	{
		if (item->uid == lowest_free_id)
		{
			lowest_free_id = item->uid + 1;
			goto restart_loop;
		}
	}
	return lowest_free_id;
}